

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_hb_timeout(raft_server *this,int32 srv_id)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  Param *pPVar4;
  bool bVar5;
  int iVar6;
  uint64_t uVar7;
  iterator iVar8;
  long lVar9;
  mutex *__mutex;
  undefined1 local_a8 [36];
  int32 srv_id_local;
  ptr<peer> p;
  Param param;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_48;
  unique_lock<std::recursive_mutex> guard;
  uint64_t last_log_idx;
  
  srv_id_local = srv_id;
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  check_srv_to_leave_timeout(this);
  if (((this->write_paused_)._M_base._M_i & 1U) != 0) {
    bVar5 = timer_helper::timeout(&this->reelection_timer_);
    if (bVar5) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (3 < iVar6) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar7 = timer_helper::get_us(&this->reelection_timer_);
          msg_if_given_abi_cxx11_
                    ((string *)local_a8,"resign by timeout, %lu us elapsed, resign now",uVar7);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x40,local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
      LOCK();
      (this->leader_).super___atomic_base<int>._M_i = -1;
      UNLOCK();
      become_follower(this);
      LOCK();
      (this->hb_alive_)._M_base._M_i = false;
      UNLOCK();
      goto LAB_002531a8;
    }
  }
  if (((((this->srv_to_join_snp_retry_required_)._M_base._M_i & 1U) == 0) ||
      (peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, peVar3 == (element_type *)0x0)) ||
     (((peVar3->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->id_ != srv_id_local)) {
    iVar8 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,&srv_id_local);
    if (iVar8.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (1 < iVar6) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_a8,"heartbeat handler error: server %d not exist",
                     (ulong)(uint)srv_id_local);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x69,local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
      goto LAB_002531a8;
    }
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar8.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                      ._M_cur + 0x10));
    if ((((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->leave_requested_)
         ._M_base._M_i & 1U) == 0) {
LAB_00252da4:
      param.myId = this->id_;
      param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
      param.peerId = (((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->id_;
      param.ctx = (void *)0x0;
      lVar9 = (**(code **)(*(long *)(this->log_store_).
                                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 0x10))();
      last_log_idx = lVar9 - 1;
      param.ctx = &last_log_idx;
      cb_func::call(&((this->ctx_)._M_t.
                      super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                      .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                    HeartBeat,&param);
      if (((this->stopping_)._M_base._M_i & 1U) == 0) {
        bVar5 = check_leadership_validity(this);
        if (bVar5) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 != (element_type *)0x0) {
            iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
            if (4 < iVar6) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)local_a8,"heartbeat timeout for %d",
                         (ulong)(uint)(((p.
                                         super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->config_).
                                       super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->id_);
              (**(code **)(*(long *)peVar2 + 0x40))
                        (peVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                         ,"handle_hb_timeout",0x8e,local_a8);
              std::__cxx11::string::~string((string *)local_a8);
            }
          }
          if ((this->role_)._M_i == leader) {
            update_target_priority(this);
            std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_58,&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
            request_append_entries(this,(ptr<peer> *)&local_58);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
            __mutex = &(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       lock_;
            std::mutex::lock(__mutex);
            if ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hb_enabled_
                == true) {
              schedule_task(this,&(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->hb_task_,
                            ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->current_hb_interval_).super___atomic_base<int>._M_i);
            }
            else {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (peVar2 != (element_type *)0x0) {
                iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
                if (4 < iVar6) {
                  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  msg_if_given_abi_cxx11_
                            ((string *)local_a8,"heartbeat is disabled for peer %d",
                             (ulong)(uint)(((p.
                                             super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->config_).
                                           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->id_);
                  (**(code **)(*(long *)peVar2 + 0x40))
                            (peVar2,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                             ,"handle_hb_timeout",0x98,local_a8);
                  std::__cxx11::string::~string((string *)local_a8);
                }
              }
            }
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
          else {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (peVar2 != (element_type *)0x0) {
              iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
              if (2 < iVar6) {
                peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                msg_if_given_abi_cxx11_
                          ((string *)local_a8,
                           "Receive a heartbeat event for %d while no longer as a leader",
                           (ulong)(uint)(((p.
                                           super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->config_).
                                         super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->id_);
                (**(code **)(*(long *)peVar2 + 0x40))
                          (peVar2,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                           ,"handle_hb_timeout",0x9d,local_a8);
                goto LAB_00252e65;
              }
            }
          }
        }
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
          if (2 < iVar6) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_a8,"Triggered HB timer but server is shutting down");
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                       ,"handle_hb_timeout",0x88,local_a8);
LAB_00252e65:
            std::__cxx11::string::~string((string *)local_a8);
          }
        }
      }
    }
    else {
      LOCK();
      ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hb_cnt_since_leave_)
      .super___atomic_base<int>._M_i =
           ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           hb_cnt_since_leave_).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      uVar1 = ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              hb_cnt_since_leave_).super___atomic_base<int>._M_i;
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (3 < iVar6) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_a8,"peer %d is not responding for %d HBs since leave request",
                     (ulong)(uint)(((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_,(ulong)uVar1);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x76,local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
      if ((int)uVar1 < _DAT_002b26bc) goto LAB_00252da4;
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (1 < iVar6) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_a8,"force remove peer %d",
                     (ulong)(uint)(((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x7a,local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      handle_join_leave_rpc_err(this,leave_cluster_request,(ptr<peer> *)&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    }
    pPVar4 = (Param *)&p;
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
      if (3 < iVar6) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a8,"retrying snapshot read for server %d",
                   (ulong)(uint)srv_id_local);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x4c,local_a8);
        std::__cxx11::string::~string((string *)local_a8);
      }
    }
    bVar5 = peer::need_to_reconnect
                      ((this->srv_to_join_).
                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (!bVar5) {
LAB_00252cc9:
      sync_log_to_new_srv(this,0);
      goto LAB_002531a8;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
      if (3 < iVar6) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a8,"rpc client for %d needs reconnection",
                   (ulong)(uint)srv_id_local);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x4e,local_a8);
        std::__cxx11::string::~string((string *)local_a8);
      }
    }
    nuraft::context::get_params((context *)&param);
    uVar7 = timer_helper::get_us
                      (&((this->srv_to_join_).
                         super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        last_resp_timer_);
    if (uVar7 / 1000 <
        (ulong)((long)DAT_002b26b0 * (long)*(int *)(CONCAT44(param.leaderId,param.myId) + 8))) {
      srv_config::serialize((srv_config *)local_a8);
      srv_config::deserialize((srv_config *)&p,(buffer *)local_a8._0_8_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      bVar5 = peer::recreate_rpc((this->srv_to_join_).
                                 super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 ,(ptr<srv_config> *)&p,
                                 (this->ctx_)._M_t.
                                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                 .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl);
      if (bVar5) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&param.peerId);
        goto LAB_00252cc9;
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (2 < iVar6) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)local_a8,"reconnection failed, will not retry");
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x5e,local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
      clear_snapshot_sync_ctx
                (this,(this->srv_to_join_).
                      super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (3 < iVar6) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_a8,"response timeout: %lu ms, will not retry",uVar7 / 1000);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x54,local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
      clear_snapshot_sync_ctx
                (this,(this->srv_to_join_).
                      super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    pPVar4 = &param;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pPVar4->peerId);
LAB_002531a8:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void raft_server::handle_hb_timeout(int32 srv_id) {
    recur_lock(lock_);

    check_srv_to_leave_timeout();

    if (write_paused_ && reelection_timer_.timeout()) {
        p_in("resign by timeout, %" PRIu64 " us elapsed, resign now",
             reelection_timer_.get_us());
        leader_ = -1;
        become_follower();

        // Clear this flag to avoid pre-vote rejection.
        hb_alive_ = false;
        return;
    }

    if ( srv_to_join_snp_retry_required_ &&
         srv_to_join_ &&
         srv_to_join_->get_id() == srv_id ) {
        p_in("retrying snapshot read for server %d", srv_id);
        if (srv_to_join_->need_to_reconnect()) {
            p_in("rpc client for %d needs reconnection", srv_id);

            ptr<raft_params> params = ctx_->get_params();
            uint64_t resp_timer_ms = srv_to_join_->get_resp_timer_us() / 1000;
            if ( resp_timer_ms >= (uint64_t)params->heart_beat_interval_ *
                                  raft_server::raft_limits_.response_limit_ ) {
                p_in("response timeout: %" PRIu64 " ms, will not retry", resp_timer_ms);
                clear_snapshot_sync_ctx(*srv_to_join_);
                return;
            }

            ptr<srv_config> s_config =
                srv_config::deserialize( *srv_to_join_->get_config().serialize() );
            bool succ = srv_to_join_->recreate_rpc(s_config, *ctx_);
            if (!succ) {
                // Reconnection failed.
                p_wn("reconnection failed, will not retry");
                clear_snapshot_sync_ctx(*srv_to_join_);
                return;
            }
        }
        sync_log_to_new_srv(0);
        return;
    }

    auto pit = peers_.find(srv_id);
    if (pit == peers_.end()) {
        p_er("heartbeat handler error: server %d not exist", srv_id);
        return;
    }

    // To avoid freeing this pointer in the middle of this function.
    ptr<peer> p = pit->second;

    if (p->is_leave_flag_set()) {
        // Leave request has been sent but not removed yet,
        // increase the counter.
        p->inc_hb_cnt_since_leave();
        int32 cur_cnt = p->get_hb_cnt_since_leave();
        p_in("peer %d is not responding for %d HBs since leave request",
             p->get_id(), cur_cnt);

        if (cur_cnt >= raft_server::raft_limits_.leave_limit_) {
            // Force remove the server.
            p_er("force remove peer %d", p->get_id());
            handle_join_leave_rpc_err(msg_type::leave_cluster_request, p);
            return;
        }
    }

    cb_func::Param param(id_, leader_, p->get_id());
    uint64_t last_log_idx = log_store_->next_slot() - 1;
    param.ctx = &last_log_idx;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::HeartBeat, &param);
    (void)rc;

    // Server is being shut down.
    if (stopping_) {
        p_wn("Triggered HB timer but server is shutting down");
        return;
    }

    if (!check_leadership_validity()) return;

    p_db("heartbeat timeout for %d", p->get_id());
    if (role_ == srv_role::leader) {
        update_target_priority();
        request_append_entries(p);
        {
            std::lock_guard<std::mutex> guard(p->get_lock());
            if (p->is_hb_enabled()) {
                // Schedule another heartbeat if heartbeat is still enabled
                schedule_task(p->get_hb_task(), p->get_current_hb_interval());
            } else {
                p_db("heartbeat is disabled for peer %d", p->get_id());
            }
        }
    } else {
        p_wn("Receive a heartbeat event for %d "
             "while no longer as a leader", p->get_id());
    }
}